

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O1

void Ree_ManCutMerge(Gia_Man_t *p,int iObj,int *pList0,int *pList1,Vec_Int_t *vCuts,
                    Hash_IntMan_t *pHash,Vec_Int_t *vData,Vec_Int_t *vXors)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int t;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  uint *puVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint *pCut0;
  uint local_b8 [8];
  uint local_98;
  uint local_94;
  int local_90;
  uint local_8c;
  Vec_Int_t *local_88;
  ulong local_80;
  Hash_IntMan_t *local_78;
  int *local_70;
  Vec_Int_t *local_68;
  int *local_60;
  int *local_58;
  ulong local_50;
  Vec_Int_t *local_48;
  ulong local_40;
  Gia_Man_t *local_38;
  
  local_48 = vData;
  local_78 = pHash;
  local_38 = p;
  if (vCuts->nCap < 2) {
    if (vCuts->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(8);
    }
    else {
      piVar7 = (int *)realloc(vCuts->pArray,8);
    }
    vCuts->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vCuts->nCap = 2;
  }
  piVar7 = vCuts->pArray;
  lVar11 = 0;
  do {
    piVar7[lVar11] = 1;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  local_68 = vXors;
  vCuts->nSize = 2;
  Vec_IntPush(vCuts,iObj);
  Vec_IntPush(vCuts,0xaa);
  if (*pList0 < 1) {
    local_94 = 0xffffffff;
    local_98 = 0xffffffff;
  }
  else {
    local_58 = pList0;
    pCut0 = (uint *)(pList0 + 1);
    local_60 = pList1 + 1;
    local_40 = (ulong)(uint)iObj;
    uVar16 = 0;
    local_98 = 0xffffffff;
    local_94 = 0xffffffff;
    local_90 = iObj;
    local_88 = vCuts;
    local_70 = pList1;
    do {
      local_50 = uVar16;
      if (0 < *pList1) {
        iVar10 = 0;
        piVar7 = local_60;
        do {
          iVar6 = *piVar7;
          uVar16 = (ulong)iVar6;
          if (-1 < (long)uVar16) {
            memcpy(local_b8,piVar7,uVar16 * 4 + 4);
          }
          uVar4 = *pCut0;
          if (0 < (int)uVar4) {
            lVar11 = 1;
            do {
              if (iVar6 < 1) {
LAB_0066517b:
                lVar13 = (long)(int)local_b8[0];
                if (lVar13 == 3) goto LAB_0066548a;
                local_b8[0] = local_b8[0] + 1;
                local_b8[lVar13 + 1] = pCut0[lVar11];
              }
              else if (pCut0[lVar11] != piVar7[1]) {
                uVar14 = 0;
                do {
                  if ((ulong)(iVar6 + 1) - 2 == uVar14) goto LAB_0066517b;
                  uVar15 = uVar14 + 1;
                  lVar13 = uVar14 + 2;
                  uVar14 = uVar15;
                } while (pCut0[lVar11] != piVar7[lVar13]);
                if (uVar16 <= uVar15) goto LAB_0066517b;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != (ulong)uVar4 + 1);
          }
          uVar16 = local_40;
          uVar4 = local_b8[1];
          if ((local_b8[0] & 0xfffffffe) != 2) {
            __assert_fail("pCut[0] == 2 || pCut[0] == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                          ,0x70,"int Ree_ManCutMergeOne(int *, int *, int *)");
          }
          if ((int)local_b8[2] < (int)local_b8[1]) {
            local_b8[1] = local_b8[2];
            local_b8[2] = uVar4;
          }
          uVar5 = local_b8[2];
          uVar4 = local_b8[1];
          if ((int)local_b8[2] <= (int)local_b8[1]) {
            __assert_fail("pCut[1] < pCut[2]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                          ,0x73,"int Ree_ManCutMergeOne(int *, int *, int *)");
          }
          if (local_b8[0] != 2) {
            if ((int)local_b8[3] < (int)local_b8[2]) {
              local_b8[2] = local_b8[3];
              local_b8[3] = uVar5;
            }
            if ((int)local_b8[2] < (int)local_b8[1]) {
              local_b8[1] = local_b8[2];
              local_b8[2] = uVar4;
            }
            if ((int)local_b8[2] <= (int)local_b8[1]) {
              __assert_fail("pCut[1] < pCut[2]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                            ,0x7a,"int Ree_ManCutMergeOne(int *, int *, int *)");
            }
            if ((int)local_b8[3] <= (int)local_b8[2]) {
              __assert_fail("pCut[2] < pCut[3]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                            ,0x7b,"int Ree_ManCutMergeOne(int *, int *, int *)");
            }
          }
          iVar6 = *vCuts->pArray;
          if (0 < iVar6) {
            puVar8 = (uint *)(vCuts->pArray + 1);
            iVar12 = 0;
            do {
              uVar14 = (ulong)*puVar8;
              if ((int)*puVar8 < 0) goto LAB_0066548a;
              if (*puVar8 == local_b8[0]) {
                uVar15 = 0xffffffffffffffff;
                do {
                  if ((1 - (uVar14 + 1)) + uVar15 == -1) goto LAB_0066548a;
                  lVar11 = uVar15 + 2;
                  uVar1 = uVar15 + 1;
                  lVar13 = uVar15 + 2;
                  uVar15 = uVar1;
                } while (puVar8[lVar11] == local_b8[lVar13]);
                if (uVar14 <= uVar1) goto LAB_0066548a;
              }
              iVar12 = iVar12 + 1;
              puVar8 = puVar8 + uVar14 + 2;
            } while (iVar12 != iVar6);
          }
          if ((iObj < 0) || (local_38->nObjs <= iObj)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar2 = local_38->pObjs;
          uVar4 = Ree_ManCutTruthOne((int *)pCut0,(int *)local_b8);
          uVar5 = Ree_ManCutTruthOne(piVar7,(int *)local_b8);
          pVVar3 = local_88;
          lVar11 = *(long *)(pGVar2 + uVar16);
          uVar9 = (uint)lVar11;
          uVar5 = uVar5 ^ (uint)((lVar11 << 2) >> 0x3f);
          uVar4 = (int)(uVar9 * 4) >> 0x1f ^ uVar4;
          local_8c = uVar4 & uVar5;
          if (((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) &&
              (uVar9 & 0x1fffffff) < ((uint)((ulong)lVar11 >> 0x20) & 0x1fffffff)) {
            local_8c = uVar4 ^ uVar5;
          }
          local_8c = local_8c & 0xff;
          uVar4 = local_8c ^ 0xff;
          if (local_8c < 0x80) {
            uVar4 = local_8c;
          }
          if ((uVar4 == 0x66) && (local_94 == 0xffffffff)) {
            local_94 = local_88->nSize;
          }
          else if ((uVar4 == 0x69) && (local_98 == 0xffffffff)) {
            local_98 = local_88->nSize;
          }
          if (local_88->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          *local_88->pArray = *local_88->pArray + 1;
          uVar16 = (ulong)local_b8[0];
          local_80 = uVar16;
          if (-1 < (int)local_b8[0]) {
            lVar11 = 0;
            do {
              Vec_IntPush(pVVar3,local_b8[lVar11]);
              lVar11 = lVar11 + 1;
            } while (uVar16 + 1 != lVar11);
          }
          Vec_IntPush(pVVar3,local_8c);
          vCuts = local_88;
          iObj = local_90;
          if ((int)local_80 == 2 &&
              (((uVar4 == 0x77 || uVar4 == 0x44) || (uVar4 == 0x22 || uVar4 == 0x11)) ||
              uVar4 == 0x66)) {
            iVar6 = Hsh_Int3ManInsert(local_78,local_b8[1],local_b8[2],0);
            vCuts = local_88;
            iObj = local_90;
LAB_0066545c:
            pVVar3 = local_48;
            Vec_IntPush(local_48,iObj);
            Vec_IntPush(pVVar3,iVar6);
            Vec_IntPush(pVVar3,local_8c);
            pList1 = local_70;
          }
          else if ((((uVar4 - 0x17 < 0x37) &&
                    ((0x40000000100001U >> ((ulong)(uVar4 - 0x17) & 0x3f) & 1) != 0)) ||
                   (uVar4 == 0x71)) || (pList1 = local_70, uVar4 == 0x69)) {
            if ((int)local_80 != 3) {
              __assert_fail("pCut[0] == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                            ,0x127,
                            "void Ree_ManCutMerge(Gia_Man_t *, int, int *, int *, Vec_Int_t *, Hash_IntMan_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar6 = Hsh_Int3ManInsert(local_78,local_b8[1],local_b8[2],local_b8[3]);
            goto LAB_0066545c;
          }
LAB_0066548a:
          iVar10 = iVar10 + 1;
          piVar7 = piVar7 + (long)*piVar7 + 2;
        } while (iVar10 < *pList1);
      }
      uVar4 = (int)local_50 + 1;
      uVar16 = (ulong)uVar4;
      pCut0 = pCut0 + (long)(int)*pCut0 + 2;
    } while ((int)uVar4 < *local_58);
  }
  pVVar3 = local_68;
  if (local_68 != (Vec_Int_t *)0x0) {
    if ((int)local_94 < 1) {
      if ((int)local_98 < 1) {
        return;
      }
      uVar4 = local_98;
      if (vCuts->nSize <= (int)local_98) goto LAB_00665566;
    }
    else {
      uVar4 = local_94;
      if (vCuts->nSize <= (int)local_94) {
LAB_00665566:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
    }
    piVar7 = vCuts->pArray;
    uVar16 = (ulong)uVar4;
    Vec_IntPush(local_68,iObj);
    if (0 < piVar7[uVar16]) {
      lVar11 = 0;
      do {
        Vec_IntPush(pVVar3,piVar7[uVar16 + lVar11 + 1]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < piVar7[uVar16]);
      if (piVar7[uVar16] == 2) {
        Vec_IntPush(pVVar3,0);
        return;
      }
    }
  }
  return;
}

Assistant:

void Ree_ManCutMerge( Gia_Man_t * p, int iObj, int * pList0, int * pList1, Vec_Int_t * vCuts, Hash_IntMan_t * pHash, Vec_Int_t * vData, Vec_Int_t * vXors )
{
    int fVerbose = 0;
    int i, k, c, Value, Truth, TruthC, * pCut0, * pCut1, pCut[6], Count = 0;
    int iXor2 = -1, iXor3 = -1;
    if ( fVerbose )
        printf( "Object %d\n", iObj );
    Vec_IntFill( vCuts, 2, 1 );
    Vec_IntPush( vCuts, iObj );
    Vec_IntPush( vCuts, 0xAA );
    Ree_ForEachCut( pList0, pCut0, i )
    Ree_ForEachCut( pList1, pCut1, k )
    {
        if ( !Ree_ManCutMergeOne(pCut0, pCut1, pCut) )
            continue;
        if ( Ree_ManCutCheckEqual(vCuts, pCut) )
            continue;
        Truth = TruthC = Ree_ManCutTruth(Gia_ManObj(p, iObj), pCut0, pCut1, pCut);
        //assert( Truth == Ree_ObjComputeTruth(p, iObj, pCut) );
        if ( Truth & 0x80 )
            Truth = 0xFF & ~Truth;
        if ( Truth == 0x66 && iXor2 == -1 )
            iXor2 = Vec_IntSize(vCuts);
        else if ( Truth == 0x69 && iXor3 == -1 )
            iXor3 = Vec_IntSize(vCuts);
        Vec_IntAddToEntry( vCuts, 0, 1 );  
        for ( c = 0; c <= pCut[0]; c++ )
            Vec_IntPush( vCuts, pCut[c] );
        Vec_IntPush( vCuts, TruthC );
        if ( (Truth == 0x66 || Truth == 0x11 || Truth == 0x22 || Truth == 0x44 || Truth == 0x77) && pCut[0] == 2 )
        {
            assert( pCut[0] == 2 );
            Value = Hsh_Int3ManInsert( pHash, pCut[1], pCut[2], 0 );
            Vec_IntPushThree( vData, iObj, Value, TruthC );
        }
        else if ( Truth == 0x69 || Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x71 )
        {
            assert( pCut[0] == 3 );
            Value = Hsh_Int3ManInsert( pHash, pCut[1], pCut[2], pCut[3] );
            Vec_IntPushThree( vData, iObj, Value, TruthC );
        }
        if ( fVerbose )
            Ree_ManCutPrint( pCut, ++Count, TruthC, iObj );
    }
    if ( !vXors )
        return;
    if ( iXor2 > 0 )
        pCut0 = Vec_IntEntryP( vCuts, iXor2 );
    else if ( iXor3 > 0 )
        pCut0 = Vec_IntEntryP( vCuts, iXor3 );
    else
        return;
    Vec_IntPush( vXors, iObj );
    for ( c = 1; c <= pCut0[0]; c++ )
        Vec_IntPush( vXors, pCut0[c] );
    if ( pCut0[0] == 2 )
        Vec_IntPush( vXors, 0 );
}